

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_drop.cpp
# Opt level: O1

unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true> __thiscall
duckdb::Transformer::TransformDropSecret(Transformer *this,PGDropSecretStmt *stmt)

{
  OnEntryNotFound OVar1;
  char *pcVar2;
  char *pcVar3;
  _Head_base<0UL,_duckdb::ExtraDropInfo_*,_false> _Var4;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ExtraDropSecretInfo_*,_false> _Var6;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> _Var7;
  SecretPersistType SVar8;
  Transformer *this_00;
  DropInfo *this_01;
  ExtraDropSecretInfo *this_02;
  pointer pDVar9;
  pointer pEVar10;
  pointer pDVar11;
  ParserException *this_03;
  long in_RDX;
  pointer *__ptr_2;
  pointer *__ptr;
  templated_unique_single_t extra_info;
  templated_unique_single_t info;
  _Head_base<0UL,_duckdb::ExtraDropSecretInfo_*,_false> local_88;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> local_80;
  allocator local_71;
  string local_70;
  string local_50;
  
  this_00 = (Transformer *)operator_new(0x80);
  DropStatement::DropStatement((DropStatement *)this_00);
  (this->parent).ptr = this_00;
  this_01 = (DropInfo *)operator_new(0x80);
  DropInfo::DropInfo(this_01);
  local_80._M_head_impl = this_01;
  this_02 = (ExtraDropSecretInfo *)operator_new(0x30);
  ExtraDropSecretInfo::ExtraDropSecretInfo(this_02);
  local_88._M_head_impl = this_02;
  pDVar9 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_80);
  (pDVar9->super_ParseInfo).field_0x9 = 0x47;
  pcVar2 = *(char **)(in_RDX + 0x10);
  pDVar9 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_80);
  pcVar3 = (char *)(pDVar9->name)._M_string_length;
  strlen(pcVar2);
  ::std::__cxx11::string::_M_replace((ulong)&pDVar9->name,0,pcVar3,(ulong)pcVar2);
  OVar1 = *(OnEntryNotFound *)(in_RDX + 0x20);
  pDVar9 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_80);
  pDVar9->if_not_found = OVar1;
  ::std::__cxx11::string::string((string *)&local_50,*(char **)(in_RDX + 8),&local_71);
  StringUtil::Upper(&local_70,&local_50);
  SVar8 = EnumUtil::FromString<duckdb::SecretPersistType>(local_70._M_dataplus._M_p);
  pEVar10 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                          *)&local_88);
  (pEVar10->super_ExtraDropInfo).field_0x9 = SVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar2 = *(char **)(in_RDX + 0x18);
  pEVar10 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                          *)&local_88);
  pcVar3 = (char *)(pEVar10->secret_storage)._M_string_length;
  strlen(pcVar2);
  ::std::__cxx11::string::_M_replace((ulong)&pEVar10->secret_storage,0,pcVar3,(ulong)pcVar2);
  pEVar10 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                          *)&local_88);
  if ((pEVar10->super_ExtraDropInfo).field_0x9 == '\x01') {
    pEVar10 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
              ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                            *)&local_88);
    if ((pEVar10->secret_storage)._M_string_length != 0) {
      this_03 = (ParserException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "Can not combine TEMPORARY with specifying a storage for drop secret","");
      ParserException::ParserException(this_03,(string *)&local_70);
      __cxa_throw(this_03,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  _Var6._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (ExtraDropSecretInfo *)0x0;
  pDVar9 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_80);
  _Var4._M_head_impl =
       (pDVar9->extra_drop_info).
       super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
       super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl;
  (pDVar9->extra_drop_info).
  super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
  super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl =
       &(_Var6._M_head_impl)->super_ExtraDropInfo;
  if (_Var4._M_head_impl != (ExtraDropInfo *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_ExtraDropInfo + 8))();
  }
  pDVar11 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
            operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                        *)this);
  _Var7._M_head_impl = local_80._M_head_impl;
  local_80._M_head_impl = (DropInfo *)0x0;
  _Var5._M_head_impl =
       (pDVar11->info).super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
       super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl;
  (pDVar11->info).super_unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DropInfo_*,_std::default_delete<duckdb::DropInfo>_>.
  super__Head_base<0UL,_duckdb::DropInfo_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var5._M_head_impl != (DropInfo *)0x0) {
    (**(code **)(*(long *)&(_Var5._M_head_impl)->super_ParseInfo + 8))();
  }
  if (local_88._M_head_impl != (ExtraDropSecretInfo *)0x0) {
    (*((local_88._M_head_impl)->super_ExtraDropInfo)._vptr_ExtraDropInfo[1])();
  }
  if (local_80._M_head_impl != (DropInfo *)0x0) {
    (*((local_80._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)
         (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)this;
}

Assistant:

unique_ptr<DropStatement> Transformer::TransformDropSecret(duckdb_libpgquery::PGDropSecretStmt &stmt) {
	auto result = make_uniq<DropStatement>();
	auto info = make_uniq<DropInfo>();
	auto extra_info = make_uniq<ExtraDropSecretInfo>();

	info->type = CatalogType::SECRET_ENTRY;
	info->name = stmt.secret_name;
	info->if_not_found = stmt.missing_ok ? OnEntryNotFound::RETURN_NULL : OnEntryNotFound::THROW_EXCEPTION;

	extra_info->persist_mode = EnumUtil::FromString<SecretPersistType>(StringUtil::Upper(stmt.persist_type));
	extra_info->secret_storage = stmt.secret_storage;

	if (extra_info->persist_mode == SecretPersistType::TEMPORARY) {
		if (!extra_info->secret_storage.empty()) {
			throw ParserException("Can not combine TEMPORARY with specifying a storage for drop secret");
		}
	}

	info->extra_drop_info = std::move(extra_info);
	result->info = std::move(info);

	return result;
}